

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O2

void lts2::PerformTVL1OnImageFAST
               (Mat *anImage,Size *patchSize,LBDOperator *LBD,Mat *result,int iterations,
               float lambda,float patchMean)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int in_register_00000084;
  Size patchSize_00;
  int iVar4;
  pointer pKVar5;
  float fVar6;
  float fVar7;
  Rect ROI;
  undefined8 local_400;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> fastPoints;
  Size local_3e0;
  undefined8 local_3d8;
  Mat ocount;
  _InputArray local_370 [4];
  Mat resultPatch;
  Mat inputPatch;
  Mat target;
  Mat freak;
  Mat patchOnes;
  
  patchSize_00.height = in_register_00000084;
  patchSize_00.width = iterations;
  if ((*(uint *)anImage & 0xfff) == 5) {
    fastPoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fastPoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fastPoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ExtractFastKeypoints(anImage,&fastPoints);
    local_3d8 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    cv::Mat::create(result,&local_3d8,5);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&inputPatch,0.0);
    _ocount = -0x3efdfffa;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,(_InputArray *)&ocount);
    local_400 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&inputPatch,0.0);
    cv::Mat::Mat(&ocount,&local_400,5,&inputPatch);
    local_3e0 = *patchSize;
    cv::Mat::ones(&inputPatch,&local_3e0,5);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)&patchOnes);
    cv::MatExpr::~MatExpr((MatExpr *)&inputPatch);
    cv::Mat::Mat(&inputPatch);
    cv::Mat::Mat(&freak);
    cv::Mat::Mat(&resultPatch);
    iVar1 = patchSize->width;
    iVar2 = patchSize->height;
    for (pKVar5 = fastPoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pKVar5 != fastPoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                  .super__Vector_impl_data._M_finish; pKVar5 = pKVar5 + 0x1c) {
      fVar7 = *(float *)(pKVar5 + 4);
      fVar6 = rintf(*(float *)pKVar5);
      iVar4 = (int)fVar6 + iVar1 / -2;
      fVar7 = rintf(fVar7);
      ROI.y = (int)fVar7 + iVar2 / -2;
      ROI.width = patchSize->width;
      ROI.height = patchSize->height;
      ROI.x = iVar4;
      if ((((-1 < ROI.y) && (ROI.y + ROI.height <= *(int *)(anImage + 8))) && (-1 < iVar4)) &&
         (iVar4 + ROI.width <= *(int *)(anImage + 0xc))) {
        cv::Mat::Mat(&target,anImage,(Rect_ *)&ROI);
        local_370[0].sz.width = 0;
        local_370[0].sz.height = 0;
        local_370[0].flags = 0x2010000;
        local_370[0].obj = &inputPatch;
        cv::Mat::copyTo((_OutputArray *)&target);
        cv::Mat::~Mat(&target);
        fVar7 = patchMean;
        if (patchMean < 0.0) {
          local_370[0].sz.width = 0;
          local_370[0].sz.height = 0;
          local_370[0].flags = 0x1010000;
          local_370[0].obj = &inputPatch;
          cv::noArray();
          cv::mean((_InputArray *)&target,local_370);
          fVar7 = (float)_target;
        }
        (*(LBD->super_LinearOperator)._vptr_LinearOperator[2])(LBD,&inputPatch,&freak);
        RealReconstructionWithTVL1(&resultPatch,LBD,&freak,iterations,lambda,patchSize_00,fVar7);
        cv::Mat::Mat(&target,result,(Rect_ *)&ROI);
        cv::operator+=(&target,&resultPatch);
        cv::Mat::Mat((Mat *)local_370,&ocount,(Rect_ *)&ROI);
        cv::Mat::operator=(&target,(Mat *)local_370);
        cv::Mat::~Mat((Mat *)local_370);
        cv::operator+=(&target,&patchOnes);
        cv::Mat::~Mat(&target);
      }
    }
    finalize(result,&ocount);
    cv::Mat::~Mat(&resultPatch);
    cv::Mat::~Mat(&freak);
    cv::Mat::~Mat(&inputPatch);
    cv::Mat::~Mat(&patchOnes);
    cv::Mat::~Mat(&ocount);
    std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
              (&fastPoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
    return;
  }
  std::__cxx11::string::string
            ((string *)&inputPatch,"anImage.type() == CV_32F && anImage.channels() == 1",
             (allocator *)&ocount);
  uVar3 = cv::error(-0xd7,(string *)&inputPatch,"PerformTVL1OnImageFAST",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x1ff);
  std::__cxx11::string::~string((string *)&inputPatch);
  _Unwind_Resume(uVar3);
}

Assistant:

void lts2::PerformTVL1OnImageFAST(cv::Mat const &anImage, cv::Size patchSize,
                                 LBDOperator &LBD, cv::Mat &result, int iterations, float lambda, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Extract image FAST points
  std::vector<cv::KeyPoint> fastPoints;
  ExtractFastKeypoints(anImage, fastPoints);

  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  int const pradius_x = patchSize.width / 2;
  int const pradius_y = patchSize.height / 2;

  std::vector<cv::KeyPoint>::const_iterator p_fast;

  for (p_fast = fastPoints.begin(); p_fast != fastPoints.end(); ++p_fast)
  {
    int x = (int)rintf(p_fast->pt.x) - pradius_x;
    int y = (int)rintf(p_fast->pt.y) - pradius_y;

    cv::Rect ROI(x, y, patchSize.width, patchSize.height);
    if ( y < 0 || y+patchSize.height > anImage.rows ||
         x < 0 || x+patchSize.width > anImage.cols )
      continue;

    anImage(ROI).copyTo(inputPatch);
    float pmean = patchMean;
    if (pmean < 0.0)
    {
      cv::Scalar mean = cv::mean(inputPatch);
      pmean = (float)mean[0];
    }

    LBD.Apply(inputPatch, freak);
    lts2::RealReconstructionWithTVL1(resultPatch, LBD, freak, iterations,
                                    lambda, patchSize, pmean);

    cv::Mat target = result(ROI);
    target += resultPatch;

    target = ocount(ROI);
    target += patchOnes;
  }

  finalize(result, ocount);
}